

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateBuilder
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  MessageBuilderLiteGenerator builderGenerator;
  MessageBuilderLiteGenerator MStack_88;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&MStack_88,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static Builder newBuilder() {\n  return (Builder) DEFAULT_INSTANCE.createBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n}\n\n"
             ,(char (*) [10])0x3dd2a7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MStack_88);
  std::__cxx11::string::~string((string *)&MStack_88);
  MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
            (&MStack_88,(this->super_MessageGenerator).descriptor_,this->context_);
  MessageBuilderLiteGenerator::Generate(&MStack_88,printer);
  MessageBuilderLiteGenerator::~MessageBuilderLiteGenerator(&MStack_88);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  MessageBuilderLiteGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}